

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O2

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessor
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          aphy_transform *transform)

{
  aphy_error aVar1;
  undefined1 local_60 [16];
  btScalar local_50;
  btScalar local_4c;
  uchar *local_48;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  
  if (accessor == (aphy_collision_mesh_accessor *)0x0) {
    aVar1 = APHY_NULL_POINTER;
  }
  else if (transform == (aphy_transform *)0x0) {
    local_3c = 2.8026e-45;
    local_60._0_4_ = accessor->index_count / 3;
    local_60._8_8_ = (ulong)accessor->index_offset + (long)accessor->indices;
    local_50 = (btScalar)(accessor->index_stride * 3);
    local_4c = (btScalar)accessor->vertex_count;
    local_48 = (uchar *)((ulong)accessor->vertex_offset + (long)accessor->vertices);
    aVar1 = APHY_OK;
    local_40 = (btScalar)accessor->vertex_stride;
    local_38 = 0.0;
    btTriangleIndexVertexArray::addIndexedMesh
              (&(this->triangleMeshData).super_btTriangleIndexVertexArray,(btIndexedMesh *)local_60,
               accessor->index_stride == 2 | PHY_INTEGER);
  }
  else {
    convertAPhyTransform((btTransform *)local_60,transform);
    addCollisionMeshAccessorWithTransform(this,accessor,(btTransform *)local_60);
    aVar1 = APHY_OK;
  }
  return aVar1;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessor(aphy_collision_mesh_accessor* accessor, aphy_transform* transform)
{
    CHECK_POINTER(accessor);

    if(transform)
        return addCollisionMeshAccessorWithTransform(accessor, convertAPhyTransform(*transform));

    btIndexedMesh indexedMesh;
    indexedMesh.m_numTriangles = accessor->index_count / 3;
    indexedMesh.m_triangleIndexBase = reinterpret_cast<uint8_t*> (accessor->indices) + accessor->index_offset;
    indexedMesh.m_triangleIndexStride = accessor->index_stride * 3;
    indexedMesh.m_numVertices = accessor->vertex_count;
    indexedMesh.m_vertexBase = reinterpret_cast<uint8_t*> (accessor->vertices) + accessor->vertex_offset;
    indexedMesh.m_vertexStride = accessor->vertex_stride;
    indexedMesh.m_vertexType = PHY_FLOAT;
    //printf("m_vertexBase %p m_triangleIndexBase %p\n", indexedMesh.m_vertexBase, indexedMesh.m_triangleIndexBase);
    //printf("m_numTriangles %d m_triangleIndexStride %d m_numVertices %d m_vertexStride %d\n", indexedMesh.m_numTriangles, indexedMesh.m_triangleIndexStride, indexedMesh.m_numVertices, indexedMesh.m_vertexStride);
    triangleMeshData.addIndexedMesh(indexedMesh, accessor->index_stride == 2 ? PHY_SHORT : PHY_INTEGER);
    return APHY_OK;
}